

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O3

void av1_get_ref_frames(RefFrameMapPair *ref_frame_map_pairs,int cur_frame_disp,AV1_COMP *cpi,
                       int gf_index,int is_parallel_encode,int *remapped_ref_idx)

{
  uint uVar1;
  AV1_PRIMARY *pAVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint *puVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  RefBufMapData buffer_map [8];
  uint local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  int *local_40;
  int *local_38;
  
  remapped_ref_idx[4] = -1;
  remapped_ref_idx[5] = -1;
  remapped_ref_idx[6] = -1;
  remapped_ref_idx[7] = -1;
  *remapped_ref_idx = -1;
  remapped_ref_idx[1] = -1;
  remapped_ref_idx[2] = -1;
  remapped_ref_idx[3] = -1;
  if ((cpi->use_ducky_encode == 0) || ((cpi->ducky_encode_info).frame_info.gop_mode != '\x01')) {
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    pAVar2 = cpi->ppi;
    bVar22 = true;
    if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) &&
       ((pAVar2->lap_enabled == 0 && ((cpi->oxcf).mode == '\x01')))) {
      bVar22 = (cpi->oxcf).gf_cfg.lag_in_frames != 0;
    }
    lVar6 = 0;
    uVar20 = 6;
    uVar21 = 0;
    do {
      iVar8 = ref_frame_map_pairs[lVar6].disp_order;
      if (iVar8 != -1) {
        uVar5 = ref_frame_map_pairs[lVar6].pyr_level;
        if ((int)uVar21 < 1) {
LAB_003c42c0:
          if ((int)uVar5 < (int)uVar20) {
            uVar20 = uVar5;
          }
          lVar14 = (long)(int)uVar21 * 0x10;
          *(int *)(local_c8 + lVar14) = (int)lVar6;
          *(int *)(local_c8 + lVar14 + 4) = iVar8;
          *(uint *)(local_c8 + lVar14 + 8) = uVar5;
          *(undefined4 *)(local_b8 + lVar14 + -4) = 0;
          uVar21 = uVar21 + 1;
        }
        else if (local_c8._4_4_ != iVar8) {
          piVar10 = (int *)(local_b8 + 4);
          uVar7 = 1;
          do {
            uVar13 = uVar7;
            if (uVar21 == uVar13) break;
            iVar18 = *piVar10;
            piVar10 = piVar10 + 4;
            uVar7 = uVar13 + 1;
          } while (iVar18 != iVar8);
          if (uVar21 <= uVar13) goto LAB_003c42c0;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    qsort(local_c8,(long)(int)uVar21,0x10,compare_map_idx_pair_asc);
    uVar5 = uVar21 - 1;
    uVar7 = (ulong)uVar5;
    if ((int)uVar21 < 1) {
      uVar9 = 0xffffffff;
    }
    else {
      local_40 = &cpi->ref_idx_to_skip;
      local_38 = (pAVar2->gf_group).skip_frame_as_ref + gf_index;
      puVar19 = (uint *)(local_b8 + uVar7 * 0x10 + -4);
      iVar8 = 0;
      uVar15 = 0xffffffff;
      local_e8 = 0xffffffff;
      uVar9 = 0xffffffff;
      bVar4 = false;
      uVar13 = uVar7;
      do {
        uVar16 = local_e8;
        if (puVar19[-1] == uVar20) {
          iVar8 = iVar8 + 1;
          uVar11 = puVar19[-2];
          if (((((cur_frame_disp <= (int)uVar11) || (local_e8 != 0xffffffff)) ||
               (uVar16 = (uint)uVar13, remapped_ref_idx[3] != -1)) &&
              ((uVar16 = local_e8, cur_frame_disp < (int)uVar11 && ((int)uVar15 == -1)))) &&
             (uVar15 = 0xffffffff, remapped_ref_idx[6] == -1)) {
            uVar15 = uVar13 & 0xffffffff;
          }
        }
        else {
          uVar11 = puVar19[-2];
          if (puVar19[-2] == cur_frame_disp) {
            remapped_ref_idx[4] = puVar19[-3];
            *puVar19 = 1;
            uVar11 = cur_frame_disp;
          }
        }
        local_e8 = uVar16;
        if (((bVar22) && ((pAVar2->gf_group).frame_parallel_level[gf_index] == 2)) &&
           (((pAVar2->gf_group).frame_parallel_level[(long)gf_index + -1] == 1 &&
            ((pAVar2->gf_group).update_type[(long)gf_index + -1] == '\x06')))) {
          piVar10 = local_38;
          uVar16 = uVar11;
          if (is_parallel_encode != 0) {
            uVar16 = puVar19[-3];
            piVar10 = local_40;
          }
          uVar1 = *piVar10;
          *puVar19 = (uint)(uVar16 == uVar1);
          if (uVar16 == uVar1) {
            bVar4 = true;
          }
        }
        uVar16 = (uint)uVar13;
        if (-1 < (int)uVar9) {
          uVar16 = uVar9;
        }
        if (cur_frame_disp <= (int)uVar11) {
          uVar16 = uVar9;
        }
        uVar9 = uVar16;
        puVar19 = puVar19 + -4;
        bVar3 = 0 < (long)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar3);
      if (iVar8 <= (int)uVar21) {
        if (-1 < (int)local_e8) {
          remapped_ref_idx[3] = *(int *)(local_c8 + (ulong)local_e8 * 0x10);
          *(undefined4 *)(local_b8 + (ulong)local_e8 * 0x10 + -4) = 1;
        }
        if (-1 < (int)uVar15) {
          remapped_ref_idx[6] = *(int *)(local_c8 + uVar15 * 0x10);
          *(undefined4 *)(local_b8 + uVar15 * 0x10 + -4) = 1;
        }
      }
      if (7 < (int)uVar21 && !bVar4) {
        uVar13 = 0xffffffff;
        uVar15 = 0;
        piVar10 = (int *)(local_c8 + 0xc);
        iVar18 = 0;
        do {
          if ((*piVar10 == 0) && ((4 < iVar8 || (piVar10[-1] != uVar20)))) {
            iVar17 = cur_frame_disp - piVar10[-2];
            iVar12 = -iVar17;
            if (0 < iVar17) {
              iVar12 = iVar17;
            }
            if (iVar18 < iVar12) {
              uVar13 = uVar15 & 0xffffffff;
              iVar18 = iVar12;
            }
          }
          uVar15 = uVar15 + 1;
          piVar10 = piVar10 + 4;
        } while (uVar21 != uVar15);
        *(undefined4 *)(local_b8 + (long)(int)uVar13 * 0x10 + -4) = 1;
      }
    }
    lVar6 = 1;
    do {
      if (remapped_ref_idx[lVar6 + -1] == -1) {
        if ((int)uVar21 < 1) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          iVar8 = -0x80000000;
          piVar10 = (int *)(local_b8 + uVar7 * 0x10 + -4);
          uVar15 = uVar7;
          do {
            if ((*piVar10 == 0) && (iVar18 = piVar10[-2], iVar18 < cur_frame_disp && iVar8 < iVar18)
               ) {
              uVar13 = uVar15 & 0xffffffff;
              iVar8 = iVar18;
            }
            piVar10 = piVar10 + -4;
            bVar22 = 0 < (long)uVar15;
            uVar15 = uVar15 - 1;
          } while (bVar22);
        }
        lVar14 = uVar13 * 0x10;
        if (*(int *)(local_b8 + lVar14 + -4) != 0) break;
        remapped_ref_idx[lVar6 + -1] = *(int *)(local_c8 + lVar14);
        *(undefined4 *)(local_b8 + lVar14 + -4) = 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar6 = 5;
    do {
      if (remapped_ref_idx[lVar6 + -1] == -1) {
        if ((int)uVar21 < 1) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          iVar8 = 0x7fffffff;
          piVar10 = (int *)(local_b8 + uVar7 * 0x10 + -4);
          uVar15 = uVar7;
          do {
            if ((*piVar10 == 0) && (iVar18 = piVar10[-2], cur_frame_disp < iVar18 && iVar18 < iVar8)
               ) {
              uVar13 = uVar15 & 0xffffffff;
              iVar8 = iVar18;
            }
            piVar10 = piVar10 + -4;
            bVar22 = 0 < (long)uVar15;
            uVar15 = uVar15 - 1;
          } while (bVar22);
        }
        lVar14 = uVar13 * 0x10;
        if (*(int *)(local_b8 + lVar14 + -4) != 0) break;
        remapped_ref_idx[lVar6 + -1] = *(int *)(local_c8 + lVar14);
        *(undefined4 *)(local_b8 + lVar14 + -4) = 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    lVar6 = 1;
    uVar7 = (ulong)uVar9;
    do {
      if (remapped_ref_idx[lVar6 + -1] == -1) {
        if ((int)uVar7 < 0) break;
        while( true ) {
          iVar8 = (int)uVar7;
          lVar14 = uVar7 * 0x10;
          if (*(int *)(local_b8 + lVar14 + -4) == 0) break;
          uVar7 = (ulong)(iVar8 - 1);
          if (iVar8 < 1) goto LAB_003c468e;
        }
        remapped_ref_idx[lVar6 + -1] = *(int *)(local_c8 + lVar14);
        *(undefined4 *)(local_b8 + lVar14 + -4) = 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
LAB_003c468e:
    uVar7 = 7;
    do {
      uVar20 = uVar5;
      if (remapped_ref_idx[uVar7 - 1] == -1) {
        while (((int)uVar9 < (int)uVar20 &&
               (uVar5 = uVar20, *(int *)(local_b8 + (ulong)uVar20 * 0x10 + -4) != 0))) {
          uVar20 = uVar20 - 1;
          uVar5 = uVar9;
        }
        if (((int)uVar5 < 0) || (lVar6 = (ulong)uVar5 * 0x10, *(int *)(local_b8 + lVar6 + -4) != 0))
        break;
        remapped_ref_idx[uVar7 - 1] = *(int *)(local_c8 + lVar6);
        *(undefined4 *)(local_b8 + lVar6 + -4) = 1;
      }
      bVar22 = 1 < uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar22);
    lVar6 = 0;
    do {
      piVar10 = remapped_ref_idx + lVar6;
      iVar8 = piVar10[1];
      iVar18 = piVar10[2];
      iVar12 = piVar10[3];
      if (*piVar10 == -1) {
        remapped_ref_idx[lVar6] = 0;
      }
      if (iVar8 == -1) {
        remapped_ref_idx[lVar6 + 1] = 0;
      }
      if (iVar18 == -1) {
        remapped_ref_idx[lVar6 + 2] = 0;
      }
      if (iVar12 == -1) {
        remapped_ref_idx[lVar6 + 3] = 0;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 8);
  }
  else {
    pAVar2 = cpi->ppi;
    lVar6 = 0;
    do {
      iVar8 = (int)(pAVar2->gf_group).ref_frame_list[gf_index][lVar6 + 1];
      if (iVar8 != -1) {
        remapped_ref_idx[lVar6] = iVar8;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    lVar6 = 0;
    do {
      iVar8 = remapped_ref_idx
              [(long)*(int *)((long)av1_get_ref_frames::ref_frame_type_order + lVar6) + -1];
      if (iVar8 != -1) goto LAB_003c41a7;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x1c);
    iVar8 = 0;
LAB_003c41a7:
    lVar6 = 0;
    do {
      piVar10 = remapped_ref_idx + lVar6;
      iVar18 = piVar10[1];
      iVar12 = piVar10[2];
      iVar17 = piVar10[3];
      if (*piVar10 == -1) {
        remapped_ref_idx[lVar6] = iVar8;
      }
      if (iVar18 == -1) {
        remapped_ref_idx[lVar6 + 1] = iVar8;
      }
      if (iVar12 == -1) {
        remapped_ref_idx[lVar6 + 2] = iVar8;
      }
      if (iVar17 == -1) {
        remapped_ref_idx[lVar6 + 3] = iVar8;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 8);
  }
  return;
}

Assistant:

void av1_get_ref_frames(RefFrameMapPair ref_frame_map_pairs[REF_FRAMES],
                        int cur_frame_disp, const AV1_COMP *cpi, int gf_index,
                        int is_parallel_encode,
                        int remapped_ref_idx[REF_FRAMES]) {
  int buf_map_idx = 0;

  // Initialize reference frame mappings.
  for (int i = 0; i < REF_FRAMES; ++i) remapped_ref_idx[i] = INVALID_IDX;

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    for (int rf = LAST_FRAME; rf < REF_FRAMES; ++rf) {
      if (cpi->ppi->gf_group.ref_frame_list[gf_index][rf] != INVALID_IDX) {
        remapped_ref_idx[rf - LAST_FRAME] =
            cpi->ppi->gf_group.ref_frame_list[gf_index][rf];
      }
    }

    int valid_rf_idx = 0;
    static const int ref_frame_type_order[REF_FRAMES - LAST_FRAME] = {
      GOLDEN_FRAME,  ALTREF_FRAME, LAST_FRAME, BWDREF_FRAME,
      ALTREF2_FRAME, LAST2_FRAME,  LAST3_FRAME
    };
    for (int i = 0; i < REF_FRAMES - LAST_FRAME; i++) {
      int rf = ref_frame_type_order[i];
      if (remapped_ref_idx[rf - LAST_FRAME] != INVALID_IDX) {
        valid_rf_idx = remapped_ref_idx[rf - LAST_FRAME];
        break;
      }
    }

    for (int i = 0; i < REF_FRAMES; ++i) {
      if (remapped_ref_idx[i] == INVALID_IDX) {
        remapped_ref_idx[i] = valid_rf_idx;
      }
    }

    return;
  }
#endif  // !CONFIG_REALTIME_ONLY

  RefBufMapData buffer_map[REF_FRAMES];
  int n_bufs = 0;
  memset(buffer_map, 0, REF_FRAMES * sizeof(buffer_map[0]));
  int min_level = MAX_ARF_LAYERS;
  int max_level = 0;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  int skip_ref_unmapping = 0;
  int is_one_pass_rt = is_one_pass_rt_params(cpi);

  // Go through current reference buffers and store display order, pyr level,
  // and map index.
  for (int map_idx = 0; map_idx < REF_FRAMES; map_idx++) {
    // Get reference frame buffer.
    RefFrameMapPair ref_pair = ref_frame_map_pairs[map_idx];
    if (ref_pair.disp_order == -1) continue;
    const int frame_order = ref_pair.disp_order;
    // Avoid duplicates.
    if (is_in_ref_map(buffer_map, frame_order, n_bufs)) continue;
    const int reference_frame_level = ref_pair.pyr_level;

    // Keep track of the lowest and highest levels that currently exist.
    if (reference_frame_level < min_level) min_level = reference_frame_level;
    if (reference_frame_level > max_level) max_level = reference_frame_level;

    buffer_map[n_bufs].map_idx = map_idx;
    buffer_map[n_bufs].disp_order = frame_order;
    buffer_map[n_bufs].pyr_level = reference_frame_level;
    buffer_map[n_bufs].used = 0;
    n_bufs++;
  }

  // Sort frames in ascending display order.
  qsort(buffer_map, n_bufs, sizeof(buffer_map[0]), compare_map_idx_pair_asc);

  int n_min_level_refs = 0;
  int closest_past_ref = -1;
  int golden_idx = -1;
  int altref_idx = -1;

  // Find the GOLDEN_FRAME and BWDREF_FRAME.
  // Also collect various stats about the reference frames for the remaining
  // mappings.
  for (int i = n_bufs - 1; i >= 0; i--) {
    if (buffer_map[i].pyr_level == min_level) {
      // Keep track of the number of lowest level frames.
      n_min_level_refs++;
      if (buffer_map[i].disp_order < cur_frame_disp && golden_idx == -1 &&
          remapped_ref_idx[GOLDEN_FRAME - LAST_FRAME] == INVALID_IDX) {
        // Save index for GOLDEN.
        golden_idx = i;
      } else if (buffer_map[i].disp_order > cur_frame_disp &&
                 altref_idx == -1 &&
                 remapped_ref_idx[ALTREF_FRAME - LAST_FRAME] == INVALID_IDX) {
        // Save index for ALTREF.
        altref_idx = i;
      }
    } else if (buffer_map[i].disp_order == cur_frame_disp) {
      // Map the BWDREF_FRAME if this is the show_existing_frame.
      add_ref_to_slot(&buffer_map[i], remapped_ref_idx, BWDREF_FRAME);
    }

    // During parallel encodes of lower layer frames, exclude the first frame
    // (frame_parallel_level 1) from being used for the reference assignment of
    // the second frame (frame_parallel_level 2).
    if (!is_one_pass_rt && gf_group->frame_parallel_level[gf_index] == 2 &&
        gf_group->frame_parallel_level[gf_index - 1] == 1 &&
        gf_group->update_type[gf_index - 1] == INTNL_ARF_UPDATE) {
      assert(gf_group->update_type[gf_index] == INTNL_ARF_UPDATE);
#if CONFIG_FPMT_TEST
      is_parallel_encode = (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_ENCODE)
                               ? is_parallel_encode
                               : 0;
#endif  // CONFIG_FPMT_TEST
      // If parallel cpis are active, use ref_idx_to_skip, else, use display
      // index.
      assert(IMPLIES(is_parallel_encode, cpi->ref_idx_to_skip != INVALID_IDX));
      assert(IMPLIES(!is_parallel_encode,
                     gf_group->skip_frame_as_ref[gf_index] != INVALID_IDX));
      buffer_map[i].used = is_parallel_encode
                               ? (buffer_map[i].map_idx == cpi->ref_idx_to_skip)
                               : (buffer_map[i].disp_order ==
                                  gf_group->skip_frame_as_ref[gf_index]);
      // In case a ref frame is excluded from being used during assignment,
      // skip the call to set_unmapped_ref(). Applicable in steady state.
      if (buffer_map[i].used) skip_ref_unmapping = 1;
    }

    // Keep track of where the frames change from being past frames to future
    // frames.
    if (buffer_map[i].disp_order < cur_frame_disp && closest_past_ref < 0)
      closest_past_ref = i;
  }

  // Do not map GOLDEN and ALTREF based on their pyramid level if all reference
  // frames have the same level.
  if (n_min_level_refs <= n_bufs) {
    // Map the GOLDEN_FRAME.
    if (golden_idx > -1)
      add_ref_to_slot(&buffer_map[golden_idx], remapped_ref_idx, GOLDEN_FRAME);
    // Map the ALTREF_FRAME.
    if (altref_idx > -1)
      add_ref_to_slot(&buffer_map[altref_idx], remapped_ref_idx, ALTREF_FRAME);
  }

  // Find the buffer to be excluded from the mapping.
  if (!skip_ref_unmapping)
    set_unmapped_ref(buffer_map, n_bufs, n_min_level_refs, min_level,
                     cur_frame_disp);

  // Place past frames in LAST_FRAME, LAST2_FRAME, and LAST3_FRAME.
  for (int frame = LAST_FRAME; frame < GOLDEN_FRAME; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer
    // in decreasing ouptut order relative to current picture.
    int next_buf_max = 0;
    int next_disp_order = INT_MIN;
    for (buf_map_idx = n_bufs - 1; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used &&
          buffer_map[buf_map_idx].disp_order < cur_frame_disp &&
          buffer_map[buf_map_idx].disp_order > next_disp_order) {
        next_disp_order = buffer_map[buf_map_idx].disp_order;
        next_buf_max = buf_map_idx;
      }
    }
    buf_map_idx = next_buf_max;
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place future frames (if there are any) in BWDREF_FRAME and ALTREF2_FRAME.
  for (int frame = BWDREF_FRAME; frame < REF_FRAMES; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer
    // in increasing ouptut order relative to current picture.
    int next_buf_max = 0;
    int next_disp_order = INT_MAX;
    for (buf_map_idx = n_bufs - 1; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used &&
          buffer_map[buf_map_idx].disp_order > cur_frame_disp &&
          buffer_map[buf_map_idx].disp_order < next_disp_order) {
        next_disp_order = buffer_map[buf_map_idx].disp_order;
        next_buf_max = buf_map_idx;
      }
    }
    buf_map_idx = next_buf_max;
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place remaining past frames.
  buf_map_idx = closest_past_ref;
  for (int frame = LAST_FRAME; frame < REF_FRAMES; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer.
    for (; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used) break;
    }
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place remaining future frames.
  buf_map_idx = n_bufs - 1;
  for (int frame = ALTREF_FRAME; frame >= LAST_FRAME; frame--) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer.
    for (; buf_map_idx > closest_past_ref; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used) break;
    }
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Fill any slots that are empty (should only happen for the first 7 frames).
  for (int i = 0; i < REF_FRAMES; ++i)
    if (remapped_ref_idx[i] == INVALID_IDX) remapped_ref_idx[i] = 0;
}